

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O3

QModelIndexList * __thiscall
QTreeView::selectedIndexes(QModelIndexList *__return_storage_ptr__,QTreeView *this)

{
  uint *puVar1;
  QArrayData *pQVar2;
  long lVar3;
  long *plVar4;
  QArrayData *pQVar5;
  char cVar6;
  QItemSelectionModel *pQVar7;
  uint uVar8;
  uint uVar9;
  long *plVar10;
  long in_FS_OFFSET;
  QArrayData *local_70;
  long local_68;
  long *plStack_60;
  undefined8 local_58;
  long lStack_50;
  long *local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QModelIndex *)0x0;
  (__return_storage_ptr__->d).size = 0;
  pQVar7 = QAbstractItemView::selectionModel((QAbstractItemView *)this);
  if (pQVar7 != (QItemSelectionModel *)0x0) {
    QAbstractItemView::selectionModel((QAbstractItemView *)this);
    QItemSelectionModel::selectedIndexes();
    plVar4 = local_48;
    lVar3 = lStack_50;
    pQVar2 = local_58;
    if (local_48 != (long *)0x0) {
      plVar10 = (long *)0x0;
      do {
        puVar1 = (uint *)(lVar3 + (long)plVar10 * 0x18);
        lStack_50 = *(long *)(puVar1 + 2);
        local_48 = *(long **)(lVar3 + 0x10 + (long)plVar10 * 0x18);
        uVar8 = puVar1[1];
        uVar9 = *puVar1;
        pQVar5 = *(QArrayData **)puVar1;
        local_58 = *(QArrayData **)puVar1;
        if (local_48 != (long *)0x0 && -1 < (int)(*puVar1 | puVar1[1])) {
          while (cVar6 = (**(code **)(*(long *)&(this->super_QAbstractItemView).
                                                super_QAbstractScrollArea.super_QFrame.super_QWidget
                                     + 0x2c0))(this,&local_58), cVar6 == '\0') {
            if (local_48 == (long *)0x0) {
              local_70 = (QArrayData *)0xffffffffffffffff;
              local_68 = 0;
              plStack_60 = (long *)0x0;
            }
            else {
              (**(code **)(*local_48 + 0x68))(&local_70,local_48,&local_58);
            }
            local_48 = plStack_60;
            local_58 = local_70;
            pQVar5 = local_58;
            lStack_50 = local_68;
            local_58._0_4_ = (uint)local_70;
            local_58._4_4_ = (uint)((ulong)local_70 >> 0x20);
            uVar8 = local_58._4_4_;
            uVar9 = (uint)local_58;
            if ((((int)(uint)local_58 < 0) || ((long)local_70 < 0)) ||
               (local_58 = local_70, plStack_60 == (long *)0x0)) goto LAB_005a6700;
          }
          uVar8 = local_58._4_4_;
          uVar9 = (uint)local_58;
          pQVar5 = local_58;
        }
LAB_005a6700:
        local_58 = pQVar5;
        if ((((int)uVar9 < 0) || ((int)uVar8 < 0)) || (local_48 == (long *)0x0)) {
          QtPrivate::QMovableArrayOps<QModelIndex>::emplace<QModelIndex_const&>
                    ((QMovableArrayOps<QModelIndex> *)__return_storage_ptr__,
                     (__return_storage_ptr__->d).size,(QModelIndex *)(lVar3 + (long)plVar10 * 0x18))
          ;
          QList<QModelIndex>::end(__return_storage_ptr__);
        }
        plVar10 = (long *)((long)plVar10 + 1);
      } while (plVar10 != plVar4);
    }
    if (pQVar2 != (QArrayData *)0x0) {
      LOCK();
      (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar2,0x18,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QModelIndexList QTreeView::selectedIndexes() const
{
    QModelIndexList viewSelected;
    QModelIndexList modelSelected;
    if (selectionModel())
        modelSelected = selectionModel()->selectedIndexes();
    for (int i = 0; i < modelSelected.size(); ++i) {
        // check that neither the parents nor the index is hidden before we add
        QModelIndex index = modelSelected.at(i);
        while (index.isValid() && !isIndexHidden(index))
            index = index.parent();
        if (index.isValid())
            continue;
        viewSelected.append(modelSelected.at(i));
    }
    return viewSelected;
}